

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O1

void __thiscall
slang::analysis::DataFlowAnalysis::noteReference
          (DataFlowAnalysis *this,ValueSymbol *symbol,Expression *lsp)

{
  undefined1 *puVar1;
  char *pcVar2;
  uint *other;
  undefined4 uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  Type *rootType;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *ppVar14;
  value_type *elements_1;
  ulong uVar15;
  ulong hash;
  pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *ppVar16;
  ulong uVar17;
  SymbolLSPMap *this_00;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  try_emplace_args_t local_175;
  uint local_174;
  Expression *local_170;
  undefined1 *local_168;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  locator res;
  undefined1 local_100 [32];
  unsigned_long local_e0;
  unsigned_long uStack_d8;
  overlap_iterator local_d0;
  iterator local_80;
  unsigned_long local_40;
  unsigned_long uStack_38;
  
  if ((this->
      super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>)
      .state.reachable == true) {
    rootType = ast::DeclaredType::getType(&symbol->declaredType);
    ast::ValueDriver::getBounds
              (&bounds,lsp,
               &(this->
                super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                ).super_FlowAnalysisBase.evalContext,rootType);
    if (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>._M_payload.
        super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_engaged == true) {
      local_d0.super_iterator.super_const_iterator.map =
           (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)symbol;
      if (this->isLValue == true) {
        local_168 = &(this->symbolToSlot).super_Storage.field_0x48;
        local_174 = (uint)(this->lvalues).
                          super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.len
        ;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = symbol;
        hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar10 = hash >> ((this->symbolToSlot).field_0x50 & 0x3f);
        lVar4 = *(long *)&(this->symbolToSlot).field_0x60;
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        uVar17 = *(ulong *)&(this->symbolToSlot).field_0x58;
        uVar15 = 0;
        uVar12 = uVar10;
        do {
          pcVar2 = (char *)(lVar4 + uVar12 * 0x10);
          cVar18 = (char)uVar3;
          auVar22[0] = -(*pcVar2 == cVar18);
          cVar19 = (char)((uint)uVar3 >> 8);
          auVar22[1] = -(pcVar2[1] == cVar19);
          cVar20 = (char)((uint)uVar3 >> 0x10);
          auVar22[2] = -(pcVar2[2] == cVar20);
          cVar21 = (char)((uint)uVar3 >> 0x18);
          auVar22[3] = -(pcVar2[3] == cVar21);
          auVar22[4] = -(pcVar2[4] == cVar18);
          auVar22[5] = -(pcVar2[5] == cVar19);
          auVar22[6] = -(pcVar2[6] == cVar20);
          auVar22[7] = -(pcVar2[7] == cVar21);
          auVar22[8] = -(pcVar2[8] == cVar18);
          auVar22[9] = -(pcVar2[9] == cVar19);
          auVar22[10] = -(pcVar2[10] == cVar20);
          auVar22[0xb] = -(pcVar2[0xb] == cVar21);
          auVar22[0xc] = -(pcVar2[0xc] == cVar18);
          auVar22[0xd] = -(pcVar2[0xd] == cVar19);
          auVar22[0xe] = -(pcVar2[0xe] == cVar20);
          auVar22[0xf] = -(pcVar2[0xf] == cVar21);
          uVar13 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
          if (uVar13 != 0) {
            lVar11 = *(long *)&(this->symbolToSlot).field_0x68 + uVar12 * 0xf0;
            do {
              iVar5 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
                }
              }
              if (*(ValueSymbol **)(lVar11 + (ulong)(uint)(iVar5 << 4)) == symbol) {
                ppVar14 = (pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)
                          ((ulong)(uint)(iVar5 << 4) + lVar11);
                goto LAB_0038fcc2;
              }
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
          }
          if ((*(byte *)(uVar12 * 0x10 + lVar4 + 0xf) &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
          lVar11 = uVar12 + uVar15;
          uVar15 = uVar15 + 1;
          uVar12 = lVar11 + 1U & uVar17;
        } while (uVar15 <= uVar17);
        ppVar14 = (pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)0x0;
LAB_0038fcc2:
        ppVar16 = ppVar14;
        local_170 = lsp;
        if (ppVar14 == (pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)0x0) {
          if (*(ulong *)&(this->symbolToSlot).field_0x78 <
              *(ulong *)&(this->symbolToSlot).field_0x70) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*,unsigned_int>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                             *)local_168,(arrays_type *)&(this->symbolToSlot).field_0x50,uVar10,hash
                       ,&local_175,(ValueSymbol **)&local_d0,&local_174);
            puVar1 = &(this->symbolToSlot).field_0x78;
            *(long *)puVar1 = *(long *)puVar1 + 1;
            ppVar16 = res.p;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*,unsigned_int>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                             *)local_168,hash,&local_175,(ValueSymbol **)&local_d0,&local_174);
            ppVar16 = res.p;
          }
        }
        if (ppVar14 == (pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)0x0) {
          SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>::
          emplace_back<slang::ast::ValueSymbol_const&>
                    (&(this->lvalues).
                      super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>,symbol)
          ;
        }
        uVar17 = (ulong)ppVar16->second;
        if ((this->
            super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
            ).state.assigned.
            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len <=
            uVar17) {
          SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
          resizeImpl<slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::ValueInitTag>
                    ((SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *)
                     &(this->
                      super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                      ).state,(ulong)(ppVar16->second + 1),(ValueInitTag *)&res);
        }
        IntervalMap<unsigned_long,_std::monostate,_3U>::unionWith
                  ((this->
                   super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                   ).state.assigned.
                   super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                   data_ + uVar17,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.first,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.second,(monostate *)&res,&this->bitMapAllocator);
        this_00 = &(this->lvalues).
                   super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.data_
                   [uVar17].assigned;
        IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                  ((overlap_iterator *)&res,this_00,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.first,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.second);
        other = &res.n;
        while( true ) {
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
                    (&local_d0.super_iterator,this_00);
          bVar9 = IntervalMapDetails::Path::operator==
                            ((Path *)other,&local_d0.super_iterator.super_const_iterator.path);
          if (local_d0.super_iterator.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
              (pointer)((long)&local_d0.super_iterator.super_const_iterator.path.path.
                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> + 0x18U
                       )) {
            operator_delete(local_d0.super_iterator.super_const_iterator.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
          }
          if (bVar9) {
            if ((undefined1 *)res._8_8_ != local_100) {
              operator_delete((void *)res._8_8_);
            }
            goto LAB_003900e7;
          }
          lVar4 = *(long *)(res._8_8_ + -0x10 + (long)res.p * 0x10);
          lVar11 = (ulong)*(uint *)(res._8_8_ + -4 + (long)res.p * 0x10) * 0x10;
          uVar17 = *(ulong *)(lVar4 + lVar11);
          uVar12 = *(ulong *)(lVar4 + 8 + lVar11);
          if ((uVar17 <= bounds.
                         super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                         _M_payload.
                         super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                         _M_payload._M_value.first) &&
             (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
              _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
              _M_payload._M_value.second <= uVar12)) break;
          if (((ulong)bounds.
                      super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                      _M_payload.
                      super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                      _M_payload._0_8_ < uVar17) &&
             (uVar12 < (ulong)bounds.
                              super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                              ._M_payload._8_8_)) {
            local_80.super_const_iterator.map =
                 (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)res.pg;
            SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
                      (&local_80.super_const_iterator.path.path,(Base *)other);
            local_40 = local_e0;
            uStack_38 = uStack_d8;
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::iterator::erase
                      (&local_80,&this->lspMapAllocator,true);
            if (local_80.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                (pointer)local_80.super_const_iterator.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement)
            {
              operator_delete(local_80.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                      (&local_d0,this_00,
                       bounds.
                       super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                       _M_payload.
                       super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                       _M_payload._M_value.first,
                       bounds.
                       super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                       _M_payload.
                       super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                       _M_payload._M_value.second);
            res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                     local_d0.super_iterator.super_const_iterator.map;
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)other,
                       (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                       &local_d0.super_iterator.super_const_iterator.path);
            local_e0 = local_d0.searchKey.left;
            uStack_d8 = local_d0.searchKey.right;
            if (local_d0.super_iterator.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                (pointer)((long)&local_d0.super_iterator.super_const_iterator.path.path.
                                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> +
                         0x18U)) {
              operator_delete(local_d0.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
          }
          else {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
            operator++((overlap_iterator *)&res);
          }
        }
        if ((undefined1 *)res._8_8_ != local_100) {
          operator_delete((void *)res._8_8_);
        }
        if (bVar9) {
LAB_003900e7:
          res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)local_170;
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::insert
                    (this_00,bounds.
                             super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                             _M_payload._M_value.first,
                     bounds.
                     super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                     _M_payload.
                     super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                     _M_payload._M_value.second,(Expression **)&res,&this->lspMapAllocator);
        }
      }
      else {
        local_170 = (Expression *)&(this->rvalues).super_Storage.field_0x128;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = symbol;
        uVar15 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar12 = uVar15 >> ((this->rvalues).field_0x130 & 0x3f);
        lVar4 = *(long *)&(this->rvalues).field_0x140;
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar15 & 0xff];
        local_168 = *(undefined1 **)&(this->rvalues).field_0x138;
        uVar10 = 0;
        uVar17 = uVar12;
        do {
          pcVar2 = (char *)(lVar4 + uVar17 * 0x10);
          cVar18 = (char)uVar3;
          auVar23[0] = -(*pcVar2 == cVar18);
          cVar19 = (char)((uint)uVar3 >> 8);
          auVar23[1] = -(pcVar2[1] == cVar19);
          cVar20 = (char)((uint)uVar3 >> 0x10);
          auVar23[2] = -(pcVar2[2] == cVar20);
          cVar21 = (char)((uint)uVar3 >> 0x18);
          auVar23[3] = -(pcVar2[3] == cVar21);
          auVar23[4] = -(pcVar2[4] == cVar18);
          auVar23[5] = -(pcVar2[5] == cVar19);
          auVar23[6] = -(pcVar2[6] == cVar20);
          auVar23[7] = -(pcVar2[7] == cVar21);
          auVar23[8] = -(pcVar2[8] == cVar18);
          auVar23[9] = -(pcVar2[9] == cVar19);
          auVar23[10] = -(pcVar2[10] == cVar20);
          auVar23[0xb] = -(pcVar2[0xb] == cVar21);
          auVar23[0xc] = -(pcVar2[0xc] == cVar18);
          auVar23[0xd] = -(pcVar2[0xd] == cVar19);
          auVar23[0xe] = -(pcVar2[0xe] == cVar20);
          auVar23[0xf] = -(pcVar2[0xf] == cVar21);
          uVar13 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
          if (uVar13 != 0) {
            lVar11 = *(long *)&(this->rvalues).field_0x148 + uVar17 * 0x438;
            do {
              uVar6 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                }
              }
              if (*(ValueSymbol **)(lVar11 + (ulong)uVar6 * 0x48) == symbol) {
                ppVar14 = (pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)
                          (lVar11 + (ulong)uVar6 * 0x48);
                goto LAB_0039003c;
              }
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
          }
          if ((*(byte *)(uVar17 * 0x10 + lVar4 + 0xf) &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7]) == 0) break;
          lVar11 = uVar17 + uVar10;
          uVar10 = uVar10 + 1;
          uVar17 = lVar11 + 1U & (ulong)local_168;
        } while (uVar10 <= local_168);
        ppVar14 = (pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)0x0;
LAB_0039003c:
        if (ppVar14 == (pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)0x0) {
          if (*(ulong *)&(this->rvalues).field_0x158 < *(ulong *)&(this->rvalues).field_0x150) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
                      ((locator *)&res,
                       (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                        *)local_170,(arrays_type *)&(this->rvalues).field_0x130,uVar12,uVar15,
                       (try_emplace_args_t *)&local_174,(ValueSymbol **)&local_d0);
            puVar1 = &(this->rvalues).field_0x158;
            *(long *)puVar1 = *(long *)puVar1 + 1;
            ppVar14 = res.p;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
                      ((locator *)&res,
                       (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                        *)local_170,uVar15,(try_emplace_args_t *)&local_174,
                       (ValueSymbol **)&local_d0);
            ppVar14 = res.p;
          }
        }
        IntervalMap<unsigned_long,_std::monostate,_3U>::unionWith
                  ((IntervalMap<unsigned_long,_std::monostate,_3U> *)&ppVar14->second,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.first,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.second,(monostate *)&res,&this->bitMapAllocator);
      }
    }
  }
  return;
}

Assistant:

void DataFlowAnalysis::noteReference(const ValueSymbol& symbol, const Expression& lsp) {
    // This feels icky but we don't count a symbol as being referenced in the procedure
    // if it's only used inside an unreachable flow path. The alternative would just
    // frustrate users, but the reason it's icky is because whether a path is reachable
    // is based on whatever level of heuristics we're willing to implement rather than
    // some well defined set of rules in the LRM.
    auto& currState = getState();
    if (!currState.reachable)
        return;

    auto bounds = ValueDriver::getBounds(lsp, getEvalContext(), symbol.getType());
    if (!bounds) {
        // This probably cannot be hit given that we early out elsewhere for
        // invalid expressions.
        return;
    }

    if (isLValue) {
        auto [it, inserted] = symbolToSlot.try_emplace(&symbol, (uint32_t)lvalues.size());
        if (inserted) {
            lvalues.emplace_back(symbol);
            SLANG_ASSERT(lvalues.size() == symbolToSlot.size());
        }

        auto index = it->second;
        if (index >= currState.assigned.size())
            currState.assigned.resize(index + 1);

        currState.assigned[index].unionWith(*bounds, {}, bitMapAllocator);

        auto& lspMap = lvalues[index].assigned;
        for (auto lspIt = lspMap.find(*bounds); lspIt != lspMap.end();) {
            // If we find an existing entry that completely contains
            // the new bounds we can just keep that one and ignore the
            // new one. Otherwise we will insert a new entry.
            auto itBounds = lspIt.bounds();
            if (itBounds.first <= bounds->first && itBounds.second >= bounds->second)
                return;

            // If the new bounds completely contain the existing entry, we can remove it.
            if (bounds->first < itBounds.first && bounds->second > itBounds.second) {
                lspMap.erase(lspIt, lspMapAllocator);
                lspIt = lspMap.find(*bounds);
            }
            else {
                ++lspIt;
            }
        }
        lspMap.insert(*bounds, &lsp, lspMapAllocator);
    }
    else {
        rvalues[&symbol].unionWith(*bounds, {}, bitMapAllocator);
    }
}